

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cc
# Opt level: O0

void __thiscall hrvo::Agent::Agent(Agent *this,Simulator *simulator)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  Vector2::Vector2((Vector2 *)(in_RDI + 1));
  Vector2::Vector2((Vector2 *)(in_RDI + 2));
  Vector2::Vector2((Vector2 *)(in_RDI + 3));
  Vector2::Vector2((Vector2 *)(in_RDI + 4));
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 9) = 0;
  *(undefined4 *)((long)in_RDI + 0x4c) = 0;
  *(undefined4 *)(in_RDI + 10) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  *(undefined1 *)(in_RDI + 0xb) = 0;
  std::
  multimap<float,_hrvo::Agent::Candidate,_std::less<float>,_std::allocator<std::pair<const_float,_hrvo::Agent::Candidate>_>_>
  ::multimap((multimap<float,_hrvo::Agent::Candidate,_std::less<float>,_std::allocator<std::pair<const_float,_hrvo::Agent::Candidate>_>_>
              *)0x103721);
  std::
  set<std::pair<float,_unsigned_long>,_std::less<std::pair<float,_unsigned_long>_>,_std::allocator<std::pair<float,_unsigned_long>_>_>
  ::set((set<std::pair<float,_unsigned_long>,_std::less<std::pair<float,_unsigned_long>_>,_std::allocator<std::pair<float,_unsigned_long>_>_>
         *)0x103737);
  std::vector<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>::vector
            ((vector<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>
              *)0x10374a);
  return;
}

Assistant:

Agent::Agent(Simulator *simulator)
    : simulator_(simulator),
      goalNo_(0U),
      maxNeighbors_(0U),
      goalRadius_(0.0F),
      maxAccel_(0.0F),
      maxSpeed_(0.0F),
      neighborDist_(0.0F),
      orientation_(0.0F),
      prefSpeed_(0.0F),
      radius_(0.0F),
      uncertaintyOffset_(0.0F),
#if HRVO_DIFFERENTIAL_DRIVE
      leftWheelSpeed_(0.0F),
      rightWheelSpeed_(0.0F),
      timeToOrientation_(0.0F),
      wheelTrack_(0.0F),
#endif /* HRVO_DIFFERENTIAL_DRIVE */
      reachedGoal_(false) {
}